

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.cpp
# Opt level: O3

void __thiscall base_blob<160U>::SetHexDeprecated(base_blob<160U> *this,string_view str)

{
  uchar *puVar1;
  char cVar2;
  uchar uVar3;
  void *pvVar4;
  size_type sVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  short *psVar12;
  long in_FS_OFFSET;
  bool bVar13;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  long local_38;
  
  pcVar10 = str._M_str;
  uVar9 = str._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_data)._M_elems[0] = '\0';
  (this->m_data)._M_elems[1] = '\0';
  (this->m_data)._M_elems[2] = '\0';
  (this->m_data)._M_elems[3] = '\0';
  (this->m_data)._M_elems[4] = '\0';
  (this->m_data)._M_elems[5] = '\0';
  (this->m_data)._M_elems[6] = '\0';
  (this->m_data)._M_elems[7] = '\0';
  (this->m_data)._M_elems[8] = '\0';
  (this->m_data)._M_elems[9] = '\0';
  (this->m_data)._M_elems[10] = '\0';
  (this->m_data)._M_elems[0xb] = '\0';
  (this->m_data)._M_elems[0xc] = '\0';
  (this->m_data)._M_elems[0xd] = '\0';
  (this->m_data)._M_elems[0xe] = '\0';
  (this->m_data)._M_elems[0xf] = '\0';
  (this->m_data)._M_elems[0x10] = '\0';
  (this->m_data)._M_elems[0x11] = '\0';
  (this->m_data)._M_elems[0x12] = '\0';
  (this->m_data)._M_elems[0x13] = '\0';
  local_48._M_len = uVar9;
  local_48._M_str = pcVar10;
  if (uVar9 != 0) {
    lVar6 = 1;
    lVar8 = 0;
    uVar11 = 0;
    do {
      pvVar4 = memchr(" \f\n\r\t\v",(int)pcVar10[uVar11],6);
      if (pvVar4 == (void *)0x0) {
        if (uVar11 == 0xffffffffffffffff) break;
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (&local_48," \f\n\r\t\v",0xffffffffffffffff,6);
        if (local_48._M_len < uVar11) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",uVar11);
          }
          goto LAB_00831605;
        }
        uVar9 = (sVar5 - uVar11) + 1;
        if (local_48._M_len - uVar11 < uVar9) {
          uVar9 = local_48._M_len - uVar11;
        }
        psVar12 = (short *)(local_48._M_str + uVar11);
        if (uVar9 < 2) {
LAB_00831546:
          if (uVar9 == 0) break;
          pcVar10 = (char *)((long)psVar12 + uVar9);
        }
        else {
          if (*psVar12 == 0x7830) {
            uVar9 = uVar9 - 2;
            psVar12 = (short *)(local_48._M_str + uVar11 + 2);
            goto LAB_00831546;
          }
          uVar7 = local_48._M_len + lVar8;
          if (sVar5 + lVar6 < local_48._M_len + lVar8) {
            uVar7 = sVar5 + lVar6;
          }
          pcVar10 = local_48._M_str + uVar7 + uVar11;
        }
        uVar11 = 0;
        goto LAB_00831556;
      }
      uVar11 = uVar11 + 1;
      lVar6 = lVar6 + -1;
      lVar8 = lVar8 + -1;
    } while (uVar9 != uVar11);
  }
  goto LAB_008315be;
  while (lVar6 = uVar11 + 1, uVar11 = uVar11 + 1, uVar7 = uVar9,
        (char *)((long)psVar12 + lVar6) != pcVar10) {
LAB_00831556:
    cVar2 = HexDigit(*(char *)((long)psVar12 + uVar11));
    uVar7 = uVar11;
    if (cVar2 == -1) break;
  }
  if (uVar7 != 0) {
    uVar9 = 0;
    do {
      uVar3 = HexDigit(*(char *)((long)psVar12 + (uVar7 - 1)));
      (this->m_data)._M_elems[uVar9] = uVar3;
      if (uVar7 == 1) break;
      cVar2 = HexDigit(*(char *)((long)psVar12 + (uVar7 - 2)));
      puVar1 = (this->m_data)._M_elems + uVar9;
      *puVar1 = *puVar1 | cVar2 << 4;
      if (uVar7 == 2) break;
      uVar7 = uVar7 - 2;
      bVar13 = uVar9 < 0x13;
      uVar9 = uVar9 + 1;
    } while (bVar13);
  }
LAB_008315be:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00831605:
  __stack_chk_fail();
}

Assistant:

void base_blob<BITS>::SetHexDeprecated(const std::string_view str)
{
    std::fill(m_data.begin(), m_data.end(), 0);

    const auto trimmed = util::RemovePrefixView(util::TrimStringView(str), "0x");

    // Note: if we are passed a greater number of digits than would fit as bytes
    // in m_data, we will be discarding the leftmost ones.
    // str="12bc" in a WIDTH=1 m_data => m_data[] == "\0xbc", not "0x12".
    size_t digits = 0;
    for (const char c : trimmed) {
        if (::HexDigit(c) == -1) break;
        ++digits;
    }
    unsigned char* p1 = m_data.data();
    unsigned char* pend = p1 + WIDTH;
    while (digits > 0 && p1 < pend) {
        *p1 = ::HexDigit(trimmed[--digits]);
        if (digits > 0) {
            *p1 |= ((unsigned char)::HexDigit(trimmed[--digits]) << 4);
            p1++;
        }
    }
}